

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# huf_decompress.c
# Opt level: O0

size_t HUF_readDTableX1_wksp
                 (HUF_DTable *DTable,void *src,size_t srcSize,void *workSpace,size_t wkspSize)

{
  byte bVar1;
  char cVar2;
  uint uVar3;
  DTableDesc DVar4;
  int iVar5;
  HUF_DTable *code;
  undefined2 local_92;
  uint local_90;
  HUF_DEltX1 D;
  U32 u;
  U32 length;
  U32 w;
  U32 n_1;
  U32 current;
  U32 nextRankStart;
  U32 n;
  DTableDesc dtd;
  size_t spaceUsed32;
  BYTE *huffWeight;
  U32 *rankVal;
  HUF_DEltX1 *dt;
  void *dtPtr;
  size_t iSize;
  U32 nbSymbols;
  U32 tableLog;
  size_t wkspSize_local;
  void *workSpace_local;
  size_t srcSize_local;
  void *src_local;
  HUF_DTable *DTable_local;
  
  iSize._4_4_ = 0;
  iSize._0_4_ = 0;
  if (wkspSize < 0x140) {
    DTable_local = (HUF_DTable *)0xffffffffffffffd4;
  }
  else {
    _nbSymbols = wkspSize;
    wkspSize_local = (size_t)workSpace;
    workSpace_local = (void *)srcSize;
    srcSize_local = (size_t)src;
    src_local = DTable;
    code = (HUF_DTable *)
           HUF_readStats((BYTE *)((long)workSpace + 0x40),0x100,(U32 *)workSpace,(U32 *)&iSize,
                         (U32 *)((long)&iSize + 4),src,srcSize);
    uVar3 = ERR_isError((size_t)code);
    DTable_local = code;
    if (uVar3 == 0) {
      DVar4 = HUF_getDTableDesc((HUF_DTable *)src_local);
      if (((uint)DVar4 & 0xff) + 1 < iSize._4_4_) {
        DTable_local = (HUF_DTable *)0xffffffffffffffd4;
      }
      else {
        nextRankStart._0_2_ = (ushort)DVar4.maxTableLog;
        nextRankStart._3_1_ = DVar4.reserved;
        nextRankStart._0_3_ = CONCAT12((char)iSize._4_4_,(ushort)nextRankStart);
        *(U32 *)src_local = nextRankStart;
        n_1 = 0;
        for (current = 1; current < iSize._4_4_ + 1; current = current + 1) {
          iVar5 = *(int *)((long)workSpace + (ulong)current * 4);
          cVar2 = (char)current;
          *(U32 *)((long)workSpace + (ulong)current * 4) = n_1;
          n_1 = (iVar5 << (cVar2 - 1U & 0x1f)) + n_1;
        }
        for (length = 0; length < (uint)iSize; length = length + 1) {
          bVar1 = ((BYTE *)((long)workSpace + 0x40))[length];
          uVar3 = (uint)bVar1;
          iVar5 = (1 << (bVar1 & 0x1f)) >> 1;
          local_92 = CONCAT11(((char)iSize._4_4_ + '\x01') - bVar1,(char)length);
          for (local_90 = *(uint *)((long)workSpace + (ulong)uVar3 * 4);
              local_90 < (uint)(*(int *)((long)workSpace + (ulong)uVar3 * 4) + iVar5);
              local_90 = local_90 + 1) {
            *(undefined2 *)((long)DTable + (ulong)local_90 * 2 + 4) = local_92;
          }
          *(int *)((long)workSpace + (ulong)uVar3 * 4) =
               iVar5 + *(int *)((long)workSpace + (ulong)uVar3 * 4);
        }
      }
    }
  }
  return (size_t)DTable_local;
}

Assistant:

size_t HUF_readDTableX1_wksp(HUF_DTable* DTable, const void* src, size_t srcSize, void* workSpace, size_t wkspSize)
{
    U32 tableLog = 0;
    U32 nbSymbols = 0;
    size_t iSize;
    void* const dtPtr = DTable + 1;
    HUF_DEltX1* const dt = (HUF_DEltX1*)dtPtr;

    U32* rankVal;
    BYTE* huffWeight;
    size_t spaceUsed32 = 0;

    rankVal = (U32 *)workSpace + spaceUsed32;
    spaceUsed32 += HUF_TABLELOG_ABSOLUTEMAX + 1;
    huffWeight = (BYTE *)((U32 *)workSpace + spaceUsed32);
    spaceUsed32 += HUF_ALIGN(HUF_SYMBOLVALUE_MAX + 1, sizeof(U32)) >> 2;

    if ((spaceUsed32 << 2) > wkspSize) return ERROR(tableLog_tooLarge);

    DEBUG_STATIC_ASSERT(sizeof(DTableDesc) == sizeof(HUF_DTable));
    /* memset(huffWeight, 0, sizeof(huffWeight)); */   /* is not necessary, even though some analyzer complain ... */

    iSize = HUF_readStats(huffWeight, HUF_SYMBOLVALUE_MAX + 1, rankVal, &nbSymbols, &tableLog, src, srcSize);
    if (HUF_isError(iSize)) return iSize;

    /* Table header */
    {   DTableDesc dtd = HUF_getDTableDesc(DTable);
        if (tableLog > (U32)(dtd.maxTableLog+1)) return ERROR(tableLog_tooLarge);   /* DTable too small, Huffman tree cannot fit in */
        dtd.tableType = 0;
        dtd.tableLog = (BYTE)tableLog;
        memcpy(DTable, &dtd, sizeof(dtd));
    }

    /* Calculate starting value for each rank */
    {   U32 n, nextRankStart = 0;
        for (n=1; n<tableLog+1; n++) {
            U32 const current = nextRankStart;
            nextRankStart += (rankVal[n] << (n-1));
            rankVal[n] = current;
    }   }

    /* fill DTable */
    {   U32 n;
        for (n=0; n<nbSymbols; n++) {
            U32 const w = huffWeight[n];
            U32 const length = (1 << w) >> 1;
            U32 u;
            HUF_DEltX1 D;
            D.byte = (BYTE)n; D.nbBits = (BYTE)(tableLog + 1 - w);
            for (u = rankVal[w]; u < rankVal[w] + length; u++)
                dt[u] = D;
            rankVal[w] += length;
    }   }

    return iSize;
}